

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindowPrivate::removeBaseWidget(QMdiSubWindowPrivate *this)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  QWidget *this_00;
  QWidget *pQVar4;
  QMdiSubWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  QMdiSubWindow *q;
  QWidget *in_stack_ffffffffffffff78;
  QWidget *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  undefined8 in_stack_ffffffffffffff90;
  undefined1 mod;
  
  mod = (undefined1)((ulong)in_stack_ffffffffffffff90 >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x62e147);
  if (bVar2) {
    this_00 = &q_func(in_RDI)->super_QWidget;
    pQVar4 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x62e170);
    QObject::removeEventFilter(&pQVar4->super_QObject);
    if ((in_RDI->super_QWidgetPrivate).layout != (QLayout *)0x0) {
      pQVar4 = (QWidget *)(in_RDI->super_QWidgetPrivate).layout;
      ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x62e1a9);
      QLayout::removeWidget((QLayout *)in_RDI,pQVar4);
      mod = (undefined1)((ulong)pQVar4 >> 0x38);
    }
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x62e1c7);
    QWidget::windowTitle((QWidget *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    QWidget::windowTitle((QWidget *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    bVar3 = ::operator==((QString *)in_stack_ffffffffffffff80,(QString *)in_stack_ffffffffffffff78);
    QString::~QString((QString *)0x62e200);
    QString::~QString((QString *)0x62e20a);
    if ((bVar3 & 1) != 0) {
      in_RDI->ignoreWindowTitleChange = true;
      pQVar4 = this_00;
      QString::QString((QString *)0x62e234);
      QWidget::setWindowTitle(pQVar4,(QString *)in_RDI);
      QString::~QString((QString *)0x62e24d);
      in_RDI->ignoreWindowTitleChange = false;
      QWidget::setWindowModified((QWidget *)in_RDI,(bool)mod);
      in_stack_ffffffffffffff80 = this_00;
      this_00 = pQVar4;
    }
    QString::clear((QString *)in_stack_ffffffffffffff80);
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x62e287);
    pQVar4 = QWidget::parentWidget((QWidget *)0x62e28f);
    if (pQVar4 == this_00) {
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0x62e2a7);
      QWidget::setParent(this_00,(QWidget *)in_RDI);
    }
    QPointer<QWidget>::operator=
              ((QPointer<QWidget> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    in_RDI->isWidgetHiddenByUs = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindowPrivate::removeBaseWidget()
{
    if (!baseWidget)
        return;

    Q_Q(QMdiSubWindow);
    baseWidget->removeEventFilter(q);
    if (layout)
        layout->removeWidget(baseWidget);
    if (baseWidget->windowTitle() == q->windowTitle()) {
        ignoreWindowTitleChange = true;
        q->setWindowTitle(QString());
        ignoreWindowTitleChange = false;
        q->setWindowModified(false);
    }
    lastChildWindowTitle.clear();
    // QTBUG-47993: parent widget can be reset before this call
    if (baseWidget->parentWidget() == q)
        baseWidget->setParent(nullptr);
    baseWidget = nullptr;
    isWidgetHiddenByUs = false;
}